

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comServer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long *plVar1;
  ErrorCode result;
  SmartPtr<IFoo> foo;
  SmartPtr<IFooService> service;
  char *local_30;
  SmartPtrHelper local_28;
  SmartPtr<IFoo> *local_20;
  ErrorCode *local_18;
  undefined1 local_10;
  
  plVar1 = (long *)JHCOM::getComponentManager();
  result = (**(code **)(*plVar1 + 0x28))(plVar1,"libfooservice.so");
  if (result == kNoError) {
    local_20 = &foo;
    foo.mObj = (IFoo *)0x103203;
    local_28._vptr_SmartPtrHelper = (_func_int **)&PTR_operator___00104d18;
    local_10 = 0;
    local_18 = &result;
    SmartPtr<IFooService>::SmartPtr(&service,&local_28);
    if (result == kNoError) {
      (**(code **)(*(long *)service.mObj + 0x28))();
    }
    else {
      jh_log_print(2,"int main(int, char **)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                   ,0x37,"Failed to get service %d");
    }
    local_20 = (SmartPtr<IFoo> *)&local_30;
    local_30 = "FooFactory";
    local_28._vptr_SmartPtrHelper = (_func_int **)&PTR_operator___00104d68;
    local_10 = 0;
    local_18 = &result;
    SmartPtr<IFoo>::SmartPtr(&foo,&local_28);
    if (result == kNoError) {
      (**(code **)(*(long *)foo.mObj + 0x28))();
    }
    else {
      jh_log_print(2,"int main(int, char **)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                   ,0x3e,"Failed to get service %d");
    }
    SmartPtr<IFoo>::~SmartPtr(&foo);
    SmartPtr<IFooService>::~SmartPtr(&service);
  }
  else {
    jh_log_print(2,"int main(int, char **)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/comServer.cpp"
                 ,0x2e,"Failed to fail library %d",result);
  }
  return 0;
}

Assistant:

int main( int argc, char *argv[] )
{
	IComponentManager *mgr = getComponentManager();
	ErrorCode result;
	
	result = mgr->LoadLibrary( "libfooservice.so" );

	if ( result != kNoError )
	{
		LOG_WARN( "Failed to fail library %d", result );
		return 0;
	}
	
	SmartPtr<IFooService> service = doGetService( "FooService", &result );
	
	if ( result == kNoError )
		service->Run();
	else
		LOG_WARN( "Failed to get service %d", result );
	
	SmartPtr<IFoo> foo = doCreateInstance( "FooFactory", &result );
	
	if ( result == kNoError )
		foo->Run();
	else
		LOG_WARN( "Failed to get service %d", result );
		
	return 0;
}